

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O2

bool iDynTree::estimateExternalWrenches
               (Model *model,SubModelDecomposition *subModels,SensorsList *sensors,
               LinkUnknownWrenchContacts *unknownWrenches,JointPosDoubleArray *jointPos,
               LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               SensorsMeasurements *ftSensorsMeasurements,estimateExternalWrenchesBuffers *bufs,
               LinkContactWrenches *outputContactWrenches)

{
  pointer pVVar1;
  ulong uVar2;
  ulong subModelIndex;
  ulong uVar3;
  Traversal *subModelTraversal;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_160;
  pointer local_150 [2];
  Wrench knownTerms;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_108;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_f0;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_d0;
  
  iDynTree::LinkContactWrenches::resize((Model *)outputContactWrenches);
  uVar2 = 0;
  do {
    subModelIndex = uVar2;
    uVar3 = iDynTree::SubModelDecomposition::getNrOfSubModels();
    if (uVar3 <= subModelIndex) break;
    subModelTraversal = (Traversal *)iDynTree::SubModelDecomposition::getTraversal((ulong)subModels)
    ;
    computeKnownTermsOfEstimationEquationWithInternalFT
              (&knownTerms,model,subModelTraversal,sensors,jointPos,linkVel,linkProperAcc,
               ftSensorsMeasurements,bufs);
    pVVar1 = (bufs->b).
             super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar1[subModelIndex].m_data[0] = (double)knownTerms._8_8_;
    pVVar1[subModelIndex].m_data[1] = (double)knownTerms._16_8_;
    pVVar1[subModelIndex].m_data[2] = (double)knownTerms._24_8_;
    (pVVar1[subModelIndex].m_data + 2)[1] = (double)knownTerms._32_8_;
    pVVar1[subModelIndex].m_data[4] = (double)knownTerms._40_8_;
    (pVVar1[subModelIndex].m_data + 4)[1] = (double)knownTerms._48_8_;
    computeMatrixOfEstimationEquationAndExtWrenchKnownTerms
              (model,subModelTraversal,unknownWrenches,jointPos,subModelIndex,bufs);
    lVar4 = iDynTree::MatrixDynSize::rows();
    if (lVar4 != 0) {
      lVar4 = iDynTree::MatrixDynSize::cols();
      if (lVar4 != 0) {
        toEigen(&local_f0,
                (bufs->A).
                super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                ._M_impl.super__Vector_impl_data._M_start + subModelIndex * 0x28);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        colPivHouseholderQr(&local_d0,
                            (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)&local_f0);
        local_150[0] = (bufs->b).
                       super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + subModelIndex;
        local_160.m_rhs =
             (Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_> *)local_150;
        local_160.m_dec = &local_d0;
        toEigen(&local_108,
                (bufs->x).
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                ._M_impl.super__Vector_impl_data._M_start + subModelIndex * 0x20);
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>>
                  (&local_108,&local_160);
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::~ColPivHouseholderQR
                  (&local_d0);
      }
    }
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      uVar6 = iDynTree::VectorDynSize::size();
      if (uVar6 <= uVar5) {
        storeResultsOfEstimation
                  (subModelTraversal,unknownWrenches,subModelIndex,bufs,outputContactWrenches);
        goto LAB_001b5374;
      }
      pdVar7 = (double *)
               iDynTree::VectorDynSize::operator()
                         ((bufs->x).
                          super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                          ._M_impl.super__Vector_impl_data._M_start + subModelIndex * 0x20,uVar5);
      uVar2 = uVar5 + 1;
    } while (!NAN(*pdVar7));
    iDynTree::reportError
              ("","estimateExternalWrenches","NaN found in estimation result, estimation failed");
LAB_001b5374:
    iDynTree::SpatialForceVector::~SpatialForceVector(&knownTerms.super_SpatialForceVector);
    uVar2 = subModelIndex + 1;
  } while (uVar6 <= uVar5);
  return uVar3 <= subModelIndex;
}

Assistant:

bool estimateExternalWrenches(const Model& model,
                              const SubModelDecomposition& subModels,
                              const SensorsList& sensors,
                              const LinkUnknownWrenchContacts& unknownWrenches,
                              const JointPosDoubleArray & jointPos,
                              const LinkVelArray& linkVel,
                              const LinkAccArray& linkProperAcc,
                              const SensorsMeasurements& ftSensorsMeasurements,
                                    estimateExternalWrenchesBuffers& bufs,
                                    LinkContactWrenches& outputContactWrenches)
{
    /**< value extracted from old iDynContact */
    double tol = 1e-7;

    // Resize the output data structure
    outputContactWrenches.resize(model);

    // Solve the problem for each submodel
    for(size_t sm=0; sm < subModels.getNrOfSubModels(); sm++ )
    {
        // Number of unknowns for this submodel
        const Traversal & subModelTraversal = subModels.getTraversal(sm);

        // First compute the known term of the estimation for each link:
        // this loop is similar to the dynamic phase of the RNEA
        // \todo pimp up performance as done in RNEADynamicPhase
        Wrench knownTerms = computeKnownTermsOfEstimationEquationWithInternalFT(model,subModelTraversal,
                                sensors,jointPos,linkVel,linkProperAcc,ftSensorsMeasurements,bufs);

        // Copy knownTerms in the buffers used for estimation
        bufs.b[sm] = knownTerms.asVector();

        // Now we compute the A matrix
        computeMatrixOfEstimationEquationAndExtWrenchKnownTerms(model,subModelTraversal,unknownWrenches,jointPos,sm,bufs);

        // If A has no unkowns then pseudoInverse can not be computed
        // In that case, we do not compute the x vector because it will have zero elements 
        if (bufs.A[sm].rows() > 0 && bufs.A[sm].cols() > 0) {
	    toEigen(bufs.x[sm]) = toEigen(bufs.A[sm]).colPivHouseholderQr().solve(toEigen(bufs.b[sm]));	    
        }

        // Check if there are any nan in the estimation results
        bool someResultIsNan = false;
        for(size_t i=0; i < bufs.x[sm].size(); i++)
        {
            if( std::isnan(bufs.x[sm](i)) )
            {
                someResultIsNan = true;
                break;
            }
        }

        if (someResultIsNan)
        {
            reportError("", "estimateExternalWrenches", "NaN found in estimation result, estimation failed");
            return false;
        }

        // We copy the estimated unknowns in the outputContactWrenches
        // Note that the logic of conversion between input/output contacts should be
        // the same used before in computeMatrixOfEstimationEquation
        storeResultsOfEstimation(subModelTraversal,unknownWrenches,sm,bufs,outputContactWrenches);
    }

    return true;
}